

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTarget::GetIncludeDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTarget *this,string *config,string *language)

{
  cmMakefile *pcVar1;
  auto_ptr<cmCompiledGeneratorExpression> aVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  LinkImplementation *pLVar7;
  pointer in_relative;
  cmTargetInternals *this_00;
  bool debugIncludes;
  string libDir;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression local_190;
  _Base_ptr local_188;
  auto_ptr<cmCompiledGeneratorExpression> local_180;
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  cmGeneratorExpression ge;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188 = (_Base_ptr)language;
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set(&uniqueIncludes);
  std::__cxx11::string::string((string *)&libDir,"INCLUDE_DIRECTORIES",(allocator *)&ge);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&this->Name,&libDir,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&libDir);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&libDir,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator *)&ge);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,&libDir);
  std::__cxx11::string::~string((string *)&libDir);
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::string::string((string *)&libDir,pcVar5,(allocator *)&ge);
    cmSystemTools::ExpandListArgument(&libDir,&debugProperties,false);
    std::__cxx11::string::~string((string *)&libDir);
  }
  if (this->DebugIncludesDone == false) {
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    debugIncludes =
         _Var6._M_current !=
         debugProperties.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugIncludes = false;
  }
  if (this->Makefile->Configured == true) {
    this->DebugIncludesDone = true;
  }
  processIncludeDirectories
            (this,&((this->Internal).Pointer)->IncludeDirectoriesEntries,__return_storage_ptr__,
             &uniqueIncludes,&dagChecker,config,debugIncludes,(string *)local_188);
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (cmTargetInternals *)&libDir;
  std::__cxx11::string::string((string *)this_00,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&ge);
  cmTargetInternals::AddInterfaceEntries
            (this_00,this,config,&libDir,&linkInterfaceIncludeDirectoriesEntries);
  std::__cxx11::string::~string((string *)&libDir);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&libDir,"APPLE",(allocator *)&ge);
  bVar3 = cmMakefile::IsOn(pcVar1,&libDir);
  std::__cxx11::string::~string((string *)&libDir);
  if (bVar3) {
    pLVar7 = GetLinkImplementation(this,config);
    for (in_relative = (pLVar7->super_LinkImplementationLibraries).Libraries.
                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
        in_relative !=
        (pLVar7->super_LinkImplementationLibraries).Libraries.
        super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
        super__Vector_impl_data._M_finish; in_relative = in_relative + 1) {
      cmsys::SystemTools::CollapseFullPath(&libDir,(string *)in_relative);
      if (GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
          frameworkCheck == '\0') {
        iVar4 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                     ::frameworkCheck);
        if (iVar4 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
      }
      bVar3 = cmsys::RegularExpression::find
                        (&GetIncludeDirectories::frameworkCheck,libDir._M_dataplus._M_p);
      if (bVar3) {
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)&ge,&GetIncludeDirectories::frameworkCheck,1);
        std::__cxx11::string::operator=((string *)&libDir,(string *)&ge);
        std::__cxx11::string::~string((string *)&ge);
        cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
        cmGeneratorExpression::Parse(&local_190,(char *)&ge);
        cge.x_ = (cmCompiledGeneratorExpression *)local_190.Backtrace;
        local_190.Backtrace = (cmListFileBacktrace *)0x0;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_190);
        local_190.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
        aVar2 = cge;
        cge.x_ = (cmCompiledGeneratorExpression *)0x0;
        local_180.x_ = (cmCompiledGeneratorExpression *)0x0;
        (((cmCompiledGeneratorExpression *)local_190.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)aVar2.x_;
        (((cmCompiledGeneratorExpression *)local_190.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&linkInterfaceIncludeDirectoriesEntries,(TargetPropertyEntry **)&local_190);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_180);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
        cmGeneratorExpression::~cmGeneratorExpression(&ge);
      }
      std::__cxx11::string::~string((string *)&libDir);
    }
  }
  processIncludeDirectories
            (this,&linkInterfaceIncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,debugIncludes,(string *)local_188);
  deleteAndClear(&linkInterfaceIncludeDirectoriesEntries);
  std::
  _Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::~_Vector_base(&linkInterfaceIncludeDirectoriesEntries.
                   super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable(&uniqueIncludes._M_ht);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
cmTarget::GetIncludeDirectories(const std::string& config,
                                const std::string& language) const
{
  std::vector<std::string> includes;
  UNORDERED_SET<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "INCLUDE_DIRECTORIES", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugIncludes = !this->DebugIncludesDone
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 "INCLUDE_DIRECTORIES")
                        != debugProperties.end();

  if (this->Makefile->IsConfigured())
    {
    this->DebugIncludesDone = true;
    }

  processIncludeDirectories(this,
                            this->Internal->IncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            language);

  std::vector<cmTargetInternals::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  this->Internal->AddInterfaceEntries(
    this, config, "INTERFACE_INCLUDE_DIRECTORIES",
    linkInterfaceIncludeDirectoriesEntries);

  if(this->Makefile->IsOn("APPLE"))
    {
    LinkImplementation const* impl = this->GetLinkImplementation(config);
    for(std::vector<cmLinkImplItem>::const_iterator
        it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      std::string libDir = cmSystemTools::CollapseFullPath(*it);

      static cmsys::RegularExpression
        frameworkCheck("(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if(!frameworkCheck.find(libDir))
        {
        continue;
        }

      libDir = frameworkCheck.match(1);

      cmGeneratorExpression ge;
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                ge.Parse(libDir.c_str());
      linkInterfaceIncludeDirectoriesEntries
              .push_back(new cmTargetInternals::TargetPropertyEntry(cge));
      }
    }

  processIncludeDirectories(this,
                            linkInterfaceIncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            language);

  deleteAndClear(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}